

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxinfo.cpp
# Opt level: O1

void __thiscall ktxInfo::usage(ktxInfo *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->super_ktxApp).name._M_dataplus._M_p,
                      (this->super_ktxApp).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             " [options] [<infile> ...]\n\n  infile ...   The file or files about which to print information. If\n               not specified, stdin is read.\n\n  Note that ktxinfo prints using UTF-8 encoding. If your console is not\n  set for UTF-8 you will see incorrect characters in output of the file\n  identifier on each side of the \"KTX nn\".\n\n  Options are:\n\n"
             ,0x15b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "  -h, --help    Print this usage message and exit.\n  -v, --version Print the version number of this program and exit.\n"
             ,0x76);
  return;
}

Assistant:

void
ktxInfo::usage()
{
    cerr <<
        "Usage: " << name << " [options] [<infile> ...]\n"
        "\n"
        "  infile ...   The file or files about which to print information. If\n"
        "               not specified, stdin is read.\n"
        "\n"
        "  Note that ktxinfo prints using UTF-8 encoding. If your console is not\n"
        "  set for UTF-8 you will see incorrect characters in output of the file\n"
        "  identifier on each side of the \"KTX nn\".\n"
        "\n"
        "  Options are:\n\n";
        ktxApp::usage();
}